

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O1

void png_do_read_transformations(png_structrp png_ptr,png_row_infop row_info)

{
  uint *puVar1;
  undefined2 uVar2;
  png_colorp ppVar3;
  png_uint_16pp pppVar4;
  png_uint_16pp pppVar5;
  size_t sVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  png_uint_32 pVar10;
  png_bytep bp;
  png_bytep ppVar11;
  png_byte pVar12;
  sbyte sVar13;
  ushort uVar14;
  byte *pbVar15;
  ulong uVar16;
  png_uint_16pp pppVar17;
  png_bytep ppVar18;
  ushort uVar19;
  png_const_color_16p trans_color;
  long lVar20;
  png_byte *ppVar21;
  ushort uVar22;
  png_uint_16 pVar23;
  uint uVar24;
  ushort uVar26;
  uint uVar27;
  ushort *puVar28;
  char *error_message;
  png_byte pVar29;
  ushort uVar30;
  byte *pbVar31;
  char cVar32;
  png_byte pVar33;
  byte bVar34;
  png_uint_16 *ppVar35;
  byte bVar36;
  png_byte pVar37;
  int iVar38;
  png_bytep ppVar39;
  byte *pbVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  int iVar44;
  ushort *puVar45;
  bool bVar46;
  uint local_70;
  int local_68 [6];
  png_row_infop local_50;
  png_uint_16pp local_48;
  ulong local_40;
  png_uint_16pp local_38;
  ulong uVar25;
  
  ppVar18 = png_ptr->row_buf;
  if (ppVar18 == (png_bytep)0x0) {
    error_message = "NULL row buffer";
    goto LAB_001149ac;
  }
  if ((png_ptr->flags & 0x4040) == 0x4000) {
    error_message = "Uninitialized row";
    goto LAB_001149ac;
  }
  if ((png_ptr->transformations >> 0xc & 1) != 0) {
    if (row_info->color_type == '\x03') {
      ppVar3 = png_ptr->palette;
      ppVar11 = png_ptr->trans_alpha;
      uVar19 = png_ptr->num_trans;
      uVar27 = row_info->width;
      uVar16 = (ulong)uVar27;
      bVar9 = row_info->bit_depth;
      if (bVar9 < 8) {
        if (bVar9 == 4) {
          if (uVar27 != 0) {
            uVar42 = uVar27 * 4 & 4;
            pbVar31 = ppVar18 + (ulong)(uVar27 - 1 >> 1) + 1;
            pbVar15 = ppVar18 + uVar16;
            uVar25 = uVar16;
            do {
              *pbVar15 = *pbVar31 >> ((byte)uVar42 & 0x1f) & 0xf;
              bVar46 = uVar42 == 4;
              uVar42 = uVar42 + 4;
              if (bVar46) {
                uVar42 = 0;
              }
              pbVar31 = pbVar31 + -(ulong)bVar46;
              pbVar15 = pbVar15 + -1;
              uVar24 = (int)uVar25 - 1;
              uVar25 = (ulong)uVar24;
            } while (uVar24 != 0);
          }
        }
        else if (bVar9 == 2) {
          if (uVar27 != 0) {
            uVar42 = ~(uVar27 * 2 + 6) & 6;
            pbVar31 = ppVar18 + (ulong)(uVar27 - 1 >> 2) + 1;
            pbVar15 = ppVar18 + uVar16;
            uVar25 = uVar16;
            do {
              *pbVar15 = *pbVar31 >> ((byte)uVar42 & 0x1f) & 3;
              bVar46 = uVar42 == 6;
              uVar42 = uVar42 + 2;
              if (bVar46) {
                uVar42 = 0;
              }
              pbVar31 = pbVar31 + -(ulong)bVar46;
              pbVar15 = pbVar15 + -1;
              uVar24 = (int)uVar25 - 1;
              uVar25 = (ulong)uVar24;
            } while (uVar24 != 0);
          }
        }
        else if ((bVar9 == 1) && (uVar27 != 0)) {
          uVar42 = -uVar27 & 7;
          pbVar15 = ppVar18 + (ulong)(uVar27 - 1 >> 3) + 1;
          ppVar39 = ppVar18 + uVar16;
          uVar25 = uVar16;
          do {
            *ppVar39 = (*pbVar15 >> (uVar42 & 0x1f) & 1) != 0;
            bVar46 = uVar42 == 7;
            uVar42 = uVar42 + 1;
            if (bVar46) {
              uVar42 = 0;
            }
            pbVar15 = pbVar15 + -(ulong)bVar46;
            ppVar39 = ppVar39 + -1;
            uVar24 = (int)uVar25 - 1;
            uVar25 = (ulong)uVar24;
          } while (uVar24 != 0);
        }
        row_info->bit_depth = '\b';
        row_info->pixel_depth = '\b';
        row_info->rowbytes = uVar16;
      }
      if (row_info->bit_depth == '\b') {
        uVar42 = uVar27;
        if (uVar19 == 0) {
          if (uVar27 != 0) {
            ppVar11 = ppVar18 + uVar27 * 3;
            pbVar15 = ppVar18 + uVar16;
            do {
              *ppVar11 = ppVar3[*pbVar15].blue;
              ppVar11[-1] = ppVar3[*pbVar15].green;
              ppVar11[-2] = ppVar3[*pbVar15].red;
              pbVar15 = pbVar15 + -1;
              ppVar11 = ppVar11 + -3;
              uVar42 = (int)uVar16 - 1;
              uVar16 = (ulong)uVar42;
            } while (uVar42 != 0);
          }
          row_info->rowbytes = (ulong)(uVar27 * 3);
          row_info->color_type = '\x02';
          row_info->bit_depth = '\b';
          row_info->channels = '\x03';
          row_info->pixel_depth = '\x18';
        }
        else {
          while (uVar42 != 0) {
            pVar12 = 0xff;
            if (ppVar18[uVar16] < uVar19) {
              pVar12 = ppVar11[ppVar18[uVar16]];
            }
            ppVar18[uVar16 * 4] = pVar12;
            ppVar18[uVar16 * 4 + -1] = ppVar3[ppVar18[uVar16]].blue;
            ppVar18[uVar16 * 4 + -2] = ppVar3[ppVar18[uVar16]].green;
            ppVar18[uVar16 * 4 + -3] = ppVar3[ppVar18[uVar16]].red;
            uVar16 = uVar16 - 1;
            uVar42 = (uint)uVar16;
          }
          row_info->rowbytes = (ulong)(uVar27 << 2);
          row_info->color_type = '\x06';
          row_info->bit_depth = '\b';
          row_info->channels = '\x04';
          row_info->pixel_depth = ' ';
        }
      }
    }
    else {
      if (((png_ptr->transformations >> 0x19 & 1) == 0) || (png_ptr->num_trans == 0)) {
        trans_color = (png_const_color_16p)0x0;
      }
      else {
        trans_color = &png_ptr->trans_color;
      }
      png_do_expand(row_info,ppVar18 + 1,trans_color);
    }
  }
  if (((png_ptr->transformations & 0x40080) == 0x40000) && ((row_info->color_type | 2) == 6)) {
    png_do_strip_channel(row_info,png_ptr->row_buf + 1,0);
  }
  if (((png_ptr->transformations & 0x600000) != 0) &&
     (bVar9 = row_info->color_type, (bVar9 & 3) == 2)) {
    puVar28 = (ushort *)(png_ptr->row_buf + 1);
    uVar19 = png_ptr->rgb_to_gray_green_coeff;
    iVar38 = 0x8000 - ((uint)png_ptr->rgb_to_gray_red_coeff + (uint)uVar19);
    uVar27 = row_info->width;
    local_40 = (ulong)uVar27;
    local_50 = row_info;
    uVar42 = (uint)uVar19;
    local_70 = (uint)png_ptr->rgb_to_gray_red_coeff;
    if (row_info->bit_depth == '\b') {
      local_48 = (png_uint_16pp)png_ptr->gamma_from_1;
      if ((local_48 == (png_uint_16pp)0x0) ||
         (ppVar18 = png_ptr->gamma_to_1, ppVar18 == (png_bytep)0x0)) {
        if (uVar27 == 0) goto LAB_0011290e;
        bVar46 = false;
        uVar16 = local_40;
        puVar45 = puVar28;
        do {
          bVar34 = (byte)*puVar45;
          if (bVar34 != (byte)puVar45[1] || *(byte *)((long)puVar45 + 1) != bVar34) {
            bVar34 = (byte)((uint)(byte)puVar45[1] * iVar38 +
                            *(byte *)((long)puVar45 + 1) * uVar42 + bVar34 * local_70 >> 0xf);
            bVar46 = true;
          }
          *(byte *)puVar28 = bVar34;
          if ((bVar9 & 4) == 0) {
            puVar45 = (ushort *)((long)puVar45 + 3);
            puVar28 = (ushort *)((long)puVar28 + 1);
          }
          else {
            pbVar15 = (byte *)((long)puVar45 + 3);
            puVar45 = puVar45 + 2;
            *(byte *)((long)puVar28 + 1) = *pbVar15;
            puVar28 = puVar28 + 1;
          }
          uVar27 = (int)uVar16 - 1;
          uVar16 = (ulong)uVar27;
        } while (uVar27 != 0);
      }
      else if (uVar27 == 0) {
LAB_0011290e:
        bVar46 = false;
      }
      else {
        bVar46 = false;
        uVar16 = local_40;
        puVar45 = puVar28;
        do {
          bVar34 = (byte)*puVar28;
          if (bVar34 == (byte)puVar28[1] && *(byte *)((long)puVar28 + 1) == bVar34) {
            if (png_ptr->gamma_table != (png_bytep)0x0) {
              pbVar15 = png_ptr->gamma_table + bVar34;
              goto LAB_00112674;
            }
          }
          else {
            pbVar15 = (byte *)((ulong)((uint)ppVar18[(byte)puVar28[1]] * iVar38 +
                                       ppVar18[*(byte *)((long)puVar28 + 1)] * uVar42 +
                                       ppVar18[bVar34] * local_70 + 0x4000 >> 0xf) + (long)local_48)
            ;
            bVar46 = true;
LAB_00112674:
            bVar34 = *pbVar15;
          }
          *(byte *)puVar45 = bVar34;
          if ((bVar9 & 4) == 0) {
            puVar28 = (ushort *)((long)puVar28 + 3);
            puVar45 = (ushort *)((long)puVar45 + 1);
          }
          else {
            pbVar15 = (byte *)((long)puVar28 + 3);
            puVar28 = puVar28 + 2;
            *(byte *)((long)puVar45 + 1) = *pbVar15;
            puVar45 = puVar45 + 1;
          }
          uVar27 = (int)uVar16 - 1;
          uVar16 = (ulong)uVar27;
        } while (uVar27 != 0);
      }
    }
    else {
      local_48 = png_ptr->gamma_16_to_1;
      if (local_48 != (png_uint_16pp)0x0) {
        local_38 = png_ptr->gamma_16_from_1;
        if (local_38 != (png_uint_16pp)0x0) {
          if (uVar27 == 0) goto LAB_0011290e;
          bVar46 = false;
          uVar16 = local_40;
          puVar45 = puVar28;
          do {
            uVar22 = *puVar28;
            uVar30 = puVar28[2];
            uVar14 = uVar22 << 8 | uVar22 >> 8;
            uVar26 = uVar30 << 8 | uVar30 >> 8;
            if ((CONCAT11((byte)puVar28[1],*(byte *)((long)puVar28 + 3)) == uVar14) &&
               (uVar14 == uVar26)) {
              if (png_ptr->gamma_16_table != (png_uint_16pp)0x0) {
                pppVar17 = png_ptr->gamma_16_table +
                           (byte)((byte)(uVar22 >> 8) >> ((byte)png_ptr->gamma_shift & 0x1f));
                uVar27 = (uint)(uVar22 & 0xff);
                goto LAB_001127b3;
              }
            }
            else {
              bVar34 = (byte)png_ptr->gamma_shift;
              uVar27 = (uint)local_48[(uVar26 & 0xff) >> (bVar34 & 0x1f)][uVar30 & 0xff] * iVar38 +
                       (uint)local_48[*(byte *)((long)puVar28 + 3) >> (bVar34 & 0x1f)]
                             [(byte)puVar28[1]] * (uint)uVar19 +
                       local_48[(uVar14 & 0xff) >> (bVar34 & 0x1f)][uVar22 & 0xff] * local_70 +
                       0x4000;
              pppVar17 = local_38 + ((uVar27 >> 0xf & 0xff) >> (bVar34 & 0x1f));
              uVar27 = uVar27 >> 0x17 & 0xff;
              bVar46 = true;
LAB_001127b3:
              uVar14 = (*pppVar17)[uVar27];
            }
            *puVar45 = uVar14 << 8 | uVar14 >> 8;
            if ((bVar9 & 4) == 0) {
              puVar28 = puVar28 + 3;
              puVar45 = puVar45 + 1;
            }
            else {
              *(byte *)(puVar45 + 1) = (byte)puVar28[3];
              pbVar15 = (byte *)((long)puVar28 + 7);
              puVar28 = puVar28 + 4;
              *(byte *)((long)puVar45 + 3) = *pbVar15;
              puVar45 = puVar45 + 2;
            }
            uVar27 = (int)uVar16 - 1;
            uVar16 = (ulong)uVar27;
          } while (uVar27 != 0);
          goto LAB_00112911;
        }
      }
      if (uVar27 == 0) goto LAB_0011290e;
      bVar46 = false;
      uVar16 = local_40;
      puVar45 = puVar28;
      do {
        uVar19 = *puVar45 << 8 | *puVar45 >> 8;
        uVar30 = puVar45[1] << 8 | puVar45[1] >> 8;
        uVar22 = puVar45[2] << 8 | puVar45[2] >> 8;
        if (uVar19 != uVar22 || uVar19 != uVar30) {
          bVar46 = true;
        }
        uVar27 = (uint)uVar22 * iVar38 + uVar30 * uVar42 + uVar19 * local_70 + 0x4000;
        *(byte *)puVar28 = (byte)(uVar27 >> 0x17);
        *(byte *)((long)puVar28 + 1) = (byte)(uVar27 >> 0xf);
        if ((bVar9 & 4) == 0) {
          puVar45 = puVar45 + 3;
          puVar28 = puVar28 + 1;
        }
        else {
          *(byte *)(puVar28 + 1) = (byte)puVar45[3];
          pbVar15 = (byte *)((long)puVar45 + 7);
          puVar45 = puVar45 + 4;
          *(byte *)((long)puVar28 + 3) = *pbVar15;
          puVar28 = puVar28 + 2;
        }
        uVar27 = (int)uVar16 - 1;
        uVar16 = (ulong)uVar27;
      } while (uVar27 != 0);
    }
LAB_00112911:
    pVar12 = row_info->channels + 0xfe;
    row_info->channels = pVar12;
    row_info->color_type = row_info->color_type & 0xfd;
    bVar9 = row_info->bit_depth * pVar12;
    row_info->pixel_depth = bVar9;
    if (bVar9 < 8) {
      uVar16 = bVar9 * local_40 + 7 >> 3;
    }
    else {
      uVar16 = (bVar9 >> 3) * local_40;
    }
    row_info->rowbytes = uVar16;
    if (bVar46) {
      png_ptr->rgb_to_gray_status = '\x01';
      if ((png_ptr->transformations & 0x600000) == 0x400000) {
        png_warning(png_ptr,"png_do_rgb_to_gray found nongray pixel");
      }
      if ((png_ptr->transformations & 0x600000) == 0x200000) {
        error_message = "png_do_rgb_to_gray found nongray pixel";
        goto LAB_001149ac;
      }
    }
  }
  if (((png_ptr->transformations & 0x4000) != 0) && ((png_ptr->mode & 0x800) == 0)) {
    png_do_gray_to_rgb(row_info,png_ptr->row_buf + 1);
  }
  if (((png_ptr->transformations & 0x80) != 0) && (row_info->color_type < 7)) {
    pbVar31 = png_ptr->row_buf;
    pbVar15 = pbVar31 + 1;
    ppVar18 = png_ptr->gamma_table;
    ppVar11 = png_ptr->gamma_from_1;
    ppVar39 = png_ptr->gamma_to_1;
    pppVar17 = png_ptr->gamma_16_table;
    pppVar4 = png_ptr->gamma_16_from_1;
    pppVar5 = png_ptr->gamma_16_to_1;
    uVar27 = png_ptr->flags;
    pVar10 = row_info->width;
    bVar9 = (byte)png_ptr->gamma_shift;
    switch(row_info->color_type) {
    case '\0':
      switch(row_info->bit_depth) {
      case '\x01':
        if (pVar10 != 0) {
          uVar19 = (png_ptr->trans_color).gray;
          uVar27 = 7;
          do {
            if (((*pbVar15 >> (uVar27 & 0x1f) & 1) != 0) == uVar19) {
              *pbVar15 = (byte)(*(int *)&(png_ptr->background).gray << ((byte)uVar27 & 0x1f)) |
                         (byte)(0x7f7f >> (7 - (byte)uVar27 & 0x1f)) & *pbVar15;
            }
            bVar46 = uVar27 == 0;
            uVar27 = uVar27 - 1;
            if (bVar46) {
              uVar27 = 7;
            }
            pbVar15 = pbVar15 + bVar46;
            pVar10 = pVar10 - 1;
          } while (pVar10 != 0);
        }
        break;
      case '\x02':
        if (ppVar18 == (png_bytep)0x0) {
          if (pVar10 != 0) {
            pVar23 = (png_ptr->trans_color).gray;
            iVar38 = 6;
            do {
              bVar9 = (byte)iVar38;
              if ((*pbVar15 >> (bVar9 & 0x1f) & 3) == pVar23) {
                *pbVar15 = (byte)(*(int *)&(png_ptr->background).gray << (bVar9 & 0x1f)) |
                           (byte)(0x3f3f >> (6 - bVar9 & 0x1f)) & *pbVar15;
              }
              bVar46 = iVar38 == 0;
              iVar38 = iVar38 + -2;
              if (bVar46) {
                iVar38 = 6;
              }
              pbVar15 = pbVar15 + bVar46;
              pVar10 = pVar10 - 1;
            } while (pVar10 != 0);
          }
        }
        else if (pVar10 != 0) {
          uVar19 = (png_ptr->trans_color).gray;
          iVar38 = 6;
          do {
            bVar9 = (byte)iVar38;
            uVar27 = *pbVar15 >> (bVar9 & 0x1f) & 3;
            if (uVar27 == uVar19) {
              uVar27 = (uint)(png_ptr->background).gray;
            }
            else {
              uVar27 = (uint)(ppVar18[(ulong)uVar27 * 0x55] >> 6);
            }
            *pbVar15 = (byte)(uVar27 << (bVar9 & 0x1f)) |
                       (byte)(0x3f3f >> (6 - bVar9 & 0x1f)) & *pbVar15;
            bVar46 = iVar38 == 0;
            iVar38 = iVar38 + -2;
            if (bVar46) {
              iVar38 = 6;
            }
            pbVar15 = pbVar15 + bVar46;
            pVar10 = pVar10 - 1;
          } while (pVar10 != 0);
        }
        break;
      case '\x03':
      case '\x05':
      case '\x06':
      case '\a':
        break;
      case '\x04':
        if (ppVar18 == (png_bytep)0x0) {
          if (pVar10 != 0) {
            pVar23 = (png_ptr->trans_color).gray;
            iVar38 = 4;
            do {
              bVar9 = (byte)iVar38;
              if ((*pbVar15 >> (bVar9 & 0x1f) & 0xf) == pVar23) {
                *pbVar15 = (byte)(*(int *)&(png_ptr->background).gray << (bVar9 & 0x1f)) |
                           (byte)(0xf0f >> (4 - bVar9 & 0x1f)) & *pbVar15;
              }
              bVar46 = iVar38 == 0;
              iVar38 = iVar38 + -4;
              if (bVar46) {
                iVar38 = 4;
              }
              pbVar15 = pbVar15 + bVar46;
              pVar10 = pVar10 - 1;
            } while (pVar10 != 0);
          }
        }
        else if (pVar10 != 0) {
          uVar19 = (png_ptr->trans_color).gray;
          iVar38 = 4;
          do {
            bVar9 = (byte)iVar38;
            uVar27 = *pbVar15 >> (bVar9 & 0x1f) & 0xf;
            if (uVar27 == uVar19) {
              uVar27 = (uint)(png_ptr->background).gray;
            }
            else {
              uVar27 = (uint)(ppVar18[uVar27 << 4 | uVar27] >> 4);
            }
            *pbVar15 = (byte)(uVar27 << (bVar9 & 0x1f)) |
                       (byte)(0xf0f >> (4 - bVar9 & 0x1f)) & *pbVar15;
            bVar46 = iVar38 == 0;
            iVar38 = iVar38 + -4;
            if (bVar46) {
              iVar38 = 4;
            }
            pbVar15 = pbVar15 + bVar46;
            pVar10 = pVar10 - 1;
          } while (pVar10 != 0);
        }
        break;
      case '\b':
        if (ppVar18 == (png_bytep)0x0) {
          if (pVar10 != 0) {
            uVar19 = (png_ptr->trans_color).gray;
            lVar20 = 0;
            do {
              if (uVar19 == pbVar15[lVar20]) {
                pbVar15[lVar20] = (byte)(png_ptr->background).gray;
              }
              lVar20 = lVar20 + 1;
            } while (pVar10 != (png_uint_32)lVar20);
          }
        }
        else if (pVar10 != 0) {
          uVar19 = (png_ptr->trans_color).gray;
          lVar20 = 0;
          do {
            if (uVar19 == pbVar15[lVar20]) {
              bVar9 = (byte)(png_ptr->background).gray;
            }
            else {
              bVar9 = ppVar18[(ushort)pbVar15[lVar20]];
            }
            pbVar15[lVar20] = bVar9;
            lVar20 = lVar20 + 1;
          } while (pVar10 != (png_uint_32)lVar20);
        }
        break;
      default:
        if (row_info->bit_depth == '\x10') {
          if (pppVar17 == (png_uint_16pp)0x0) {
            if (pVar10 != 0) {
              uVar19 = (png_ptr->trans_color).gray;
              lVar20 = 0;
              do {
                if ((ushort)(*(ushort *)(pbVar31 + lVar20 * 2 + 1) << 8 |
                            *(ushort *)(pbVar31 + lVar20 * 2 + 1) >> 8) == uVar19) {
                  uVar22 = (png_ptr->background).gray;
                  *(ushort *)(pbVar31 + lVar20 * 2 + 1) = uVar22 << 8 | uVar22 >> 8;
                }
                lVar20 = lVar20 + 1;
              } while (pVar10 != (png_uint_32)lVar20);
            }
          }
          else if (pVar10 != 0) {
            pVar23 = (png_ptr->trans_color).gray;
            lVar20 = 0;
            do {
              bVar34 = pbVar15[lVar20 * 2];
              ppVar35 = &(png_ptr->background).gray;
              if (CONCAT11(bVar34,pbVar31[lVar20 * 2 + 2]) != pVar23) {
                ppVar35 = (png_uint_16 *)
                          ((ulong)((uint)bVar34 + (uint)bVar34) +
                          (long)pppVar17[pbVar31[lVar20 * 2 + 2] >> (bVar9 & 0x1f)]);
              }
              *(png_uint_16 *)(pbVar15 + lVar20 * 2) = *ppVar35 << 8 | *ppVar35 >> 8;
              lVar20 = lVar20 + 1;
            } while (pVar10 != (png_uint_32)lVar20);
          }
        }
      }
      break;
    case '\x02':
      if (row_info->bit_depth == '\b') {
        if (ppVar18 == (png_bytep)0x0) {
          if (pVar10 != 0) {
            uVar19 = (png_ptr->trans_color).red;
            do {
              pbVar15 = pbVar31 + 3;
              if (((uVar19 == pbVar31[1]) && ((png_ptr->trans_color).green == (ushort)pbVar31[2]))
                 && ((png_ptr->trans_color).blue == (ushort)*pbVar15)) {
                pbVar31[1] = (byte)(png_ptr->background).red;
                pbVar31[2] = (byte)(png_ptr->background).green;
                *pbVar15 = (byte)(png_ptr->background).blue;
              }
              pVar10 = pVar10 - 1;
              pbVar31 = pbVar15;
            } while (pVar10 != 0);
          }
        }
        else if (pVar10 != 0) {
          uVar19 = (png_ptr->trans_color).red;
          do {
            pbVar15 = pbVar31 + 3;
            if (((uVar19 == pbVar31[1]) && ((png_ptr->trans_color).green == (ushort)pbVar31[2])) &&
               ((png_ptr->trans_color).blue == (ushort)*pbVar15)) {
              pbVar31[1] = (byte)(png_ptr->background).red;
              pbVar31[2] = (byte)(png_ptr->background).green;
              bVar9 = (byte)(png_ptr->background).blue;
            }
            else {
              pbVar31[1] = ppVar18[(ushort)pbVar31[1]];
              pbVar31[2] = ppVar18[pbVar31[2]];
              bVar9 = ppVar18[*pbVar15];
            }
            *pbVar15 = bVar9;
            pVar10 = pVar10 - 1;
            pbVar31 = pbVar15;
          } while (pVar10 != 0);
        }
      }
      else if (pppVar17 == (png_uint_16pp)0x0) {
        if (pVar10 != 0) {
          uVar19 = (png_ptr->trans_color).red;
          do {
            if ((((ushort)(*(ushort *)(pbVar31 + 1) << 8 | *(ushort *)(pbVar31 + 1) >> 8) == uVar19)
                && ((ushort)(*(ushort *)(pbVar31 + 3) << 8 | *(ushort *)(pbVar31 + 3) >> 8) ==
                    (png_ptr->trans_color).green)) &&
               ((ushort)(*(ushort *)(pbVar31 + 5) << 8 | *(ushort *)(pbVar31 + 5) >> 8) ==
                (png_ptr->trans_color).blue)) {
              uVar22 = (png_ptr->background).red;
              *(ushort *)(pbVar31 + 1) = uVar22 << 8 | uVar22 >> 8;
              uVar22 = (png_ptr->background).green;
              *(ushort *)(pbVar31 + 3) = uVar22 << 8 | uVar22 >> 8;
              uVar22 = (png_ptr->background).blue;
              *(ushort *)(pbVar31 + 5) = uVar22 << 8 | uVar22 >> 8;
            }
            pVar10 = pVar10 - 1;
            pbVar31 = pbVar31 + 6;
          } while (pVar10 != 0);
        }
      }
      else if (pVar10 != 0) {
        pVar23 = (png_ptr->trans_color).red;
        do {
          bVar34 = pbVar31[6];
          if (((CONCAT11(pbVar31[1],pbVar31[2]) == pVar23) &&
              ((ushort)(*(ushort *)(pbVar31 + 3) << 8 | *(ushort *)(pbVar31 + 3) >> 8) ==
               (png_ptr->trans_color).green)) &&
             (CONCAT11(pbVar31[5],bVar34) == (png_ptr->trans_color).blue)) {
            uVar19 = (png_ptr->background).red;
            *(ushort *)(pbVar31 + 1) = uVar19 << 8 | uVar19 >> 8;
            uVar19 = (png_ptr->background).green;
            *(ushort *)(pbVar31 + 3) = uVar19 << 8 | uVar19 >> 8;
            ppVar35 = &(png_ptr->background).blue;
          }
          else {
            *(png_uint_16 *)(pbVar31 + 1) =
                 pppVar17[pbVar31[2] >> (bVar9 & 0x1f)][pbVar31[1]] << 8 |
                 pppVar17[pbVar31[2] >> (bVar9 & 0x1f)][pbVar31[1]] >> 8;
            *(png_uint_16 *)(pbVar31 + 3) =
                 pppVar17[pbVar31[4] >> (bVar9 & 0x1f)][pbVar31[3]] << 8 |
                 pppVar17[pbVar31[4] >> (bVar9 & 0x1f)][pbVar31[3]] >> 8;
            ppVar35 = (png_uint_16 *)
                      ((ulong)((uint)pbVar31[5] * 2) + (long)pppVar17[bVar34 >> (bVar9 & 0x1f)]);
          }
          *(png_uint_16 *)(pbVar31 + 5) = *ppVar35 << 8 | *ppVar35 >> 8;
          pVar10 = pVar10 - 1;
          pbVar31 = pbVar31 + 6;
        } while (pVar10 != 0);
      }
      break;
    case '\x04':
      if (row_info->bit_depth == '\b') {
        if ((ppVar11 == (png_bytep)0x0 || ppVar39 == (png_bytep)0x0) || ppVar18 == (png_bytep)0x0) {
          if (pVar10 != 0) {
            lVar20 = 0;
            do {
              bVar9 = pbVar31[lVar20 * 2 + 2];
              if (bVar9 != 0xff) {
                if (bVar9 == 0) {
                  bVar9 = (byte)(png_ptr->background).gray;
                }
                else {
                  uVar19 = (ushort)(byte)~bVar9 * (png_ptr->background).gray +
                           (ushort)pbVar31[lVar20 * 2 + 1] * (ushort)bVar9 + 0x80;
                  bVar9 = (byte)((uint)(uVar19 >> 8) + (uint)uVar19 >> 8);
                }
                pbVar31[lVar20 * 2 + 1] = bVar9;
              }
              lVar20 = lVar20 + 1;
            } while (pVar10 != (png_uint_32)lVar20);
          }
        }
        else if (pVar10 != 0) {
          lVar20 = 0;
          do {
            bVar9 = pbVar31[lVar20 * 2 + 2];
            if (bVar9 == 0) {
              bVar9 = (byte)(png_ptr->background).gray;
            }
            else if (bVar9 == 0xff) {
              bVar9 = ppVar18[pbVar15[lVar20 * 2]];
            }
            else {
              uVar42 = (uint)(ushort)((ushort)(byte)~bVar9 * (png_ptr->background_1).gray) +
                       (uint)ppVar39[pbVar15[lVar20 * 2]] * (uint)bVar9 + 0x80 & 0xffff;
              bVar9 = (byte)((uVar42 >> 8) + uVar42 >> 8);
              if ((uVar27 >> 0xd & 1) == 0) {
                bVar9 = ppVar11[bVar9];
              }
            }
            pbVar15[lVar20 * 2] = bVar9;
            lVar20 = lVar20 + 1;
          } while (pVar10 != (png_uint_32)lVar20);
        }
      }
      else if ((pppVar4 == (png_uint_16pp)0x0 || pppVar17 == (png_uint_16pp)0x0) ||
               pppVar5 == (png_uint_16pp)0x0) {
        if (pVar10 != 0) {
          lVar20 = 0;
          do {
            uVar19 = *(ushort *)(pbVar31 + lVar20 * 4 + 3) << 8 |
                     *(ushort *)(pbVar31 + lVar20 * 4 + 3) >> 8;
            if (uVar19 != 0xffff) {
              if (uVar19 == 0) {
                pVar23 = (png_ptr->background).gray;
                pbVar15[lVar20 * 4] = (byte)(pVar23 >> 8);
                pbVar31[lVar20 * 4 + 2] = (byte)pVar23;
              }
              else {
                iVar44 = (((*(ushort *)(pbVar15 + lVar20 * 4) & 0xff00) << 8 |
                          (uint)*(ushort *)(pbVar15 + lVar20 * 4) << 0x18) >> 0x10) * (uint)uVar19;
                iVar38 = (uVar19 ^ 0xffff) * (uint)(png_ptr->background).gray;
                iVar38 = (iVar38 + iVar44 + 0x8000U >> 0x10) + iVar38 + iVar44 + 0x8000;
                pbVar15[lVar20 * 4] = (byte)((uint)iVar38 >> 0x18);
                pbVar31[lVar20 * 4 + 2] = (byte)((uint)iVar38 >> 0x10);
              }
            }
            lVar20 = lVar20 + 1;
          } while (pVar10 != (png_uint_32)lVar20);
        }
      }
      else if (pVar10 != 0) {
        lVar20 = 0;
        do {
          uVar19 = *(ushort *)(pbVar31 + lVar20 * 4 + 3) << 8 |
                   *(ushort *)(pbVar31 + lVar20 * 4 + 3) >> 8;
          if (uVar19 == 0) {
            pVar23 = (png_ptr->background).gray;
LAB_0011358b:
            pbVar15[lVar20 * 4] = (byte)(pVar23 >> 8);
            pbVar31[lVar20 * 4 + 2] = (byte)pVar23;
          }
          else {
            if (uVar19 == 0xffff) {
              pVar23 = pppVar17[pbVar31[lVar20 * 4 + 2] >> (bVar9 & 0x1f)][pbVar15[lVar20 * 4]];
              goto LAB_0011358b;
            }
            iVar44 = (uint)pppVar5[pbVar31[lVar20 * 4 + 2] >> (bVar9 & 0x1f)][pbVar15[lVar20 * 4]] *
                     (uint)uVar19;
            iVar38 = (uVar19 ^ 0xffff) * (uint)(png_ptr->background_1).gray;
            uVar42 = (iVar44 + iVar38 + 0x8000U >> 0x10) + iVar44 + iVar38 + 0x8000;
            pVar23 = (png_uint_16)(uVar42 >> 0x10);
            if ((uVar27 >> 0xd & 1) == 0) {
              pVar23 = pppVar4[(uVar42 >> 0x10 & 0xff) >> (bVar9 & 0x1f)][uVar42 >> 0x18];
            }
            *(png_uint_16 *)(pbVar15 + lVar20 * 4) = pVar23 << 8 | pVar23 >> 8;
          }
          lVar20 = lVar20 + 1;
        } while (pVar10 != (png_uint_32)lVar20);
      }
      break;
    case '\x06':
      if (row_info->bit_depth == '\b') {
        if ((ppVar11 == (png_bytep)0x0 || ppVar39 == (png_bytep)0x0) || ppVar18 == (png_bytep)0x0) {
          if (pVar10 != 0) {
            lVar20 = 0;
            do {
              bVar9 = pbVar31[lVar20 * 4 + 4];
              if (bVar9 != 0xff) {
                if (bVar9 == 0) {
                  pbVar31[lVar20 * 4 + 1] = (byte)(png_ptr->background).red;
                  pbVar31[lVar20 * 4 + 2] = (byte)(png_ptr->background).green;
                  pbVar31[lVar20 * 4 + 3] = (byte)(png_ptr->background).blue;
                }
                else {
                  bVar34 = ~bVar9;
                  iVar38 = (uint)(png_ptr->background).red * (uint)bVar34 +
                           (uint)pbVar31[lVar20 * 4 + 1] * (uint)bVar9;
                  pbVar31[lVar20 * 4 + 1] =
                       (byte)((iVar38 + 0x80U >> 8 & 0xff) + iVar38 + 0x80 >> 8);
                  iVar38 = (uint)(png_ptr->background).green * (uint)bVar34 +
                           (uint)pbVar31[lVar20 * 4 + 2] * (uint)bVar9;
                  pbVar31[lVar20 * 4 + 2] =
                       (byte)((iVar38 + 0x80U >> 8 & 0xff) + iVar38 + 0x80 >> 8);
                  iVar38 = (uint)(png_ptr->background).blue * (uint)bVar34 +
                           (uint)pbVar31[lVar20 * 4 + 3] * (uint)bVar9;
                  pbVar31[lVar20 * 4 + 3] =
                       (byte)((iVar38 + 0x80U >> 8 & 0xff) + iVar38 + 0x80 >> 8);
                }
              }
              lVar20 = lVar20 + 1;
            } while (pVar10 != (png_uint_32)lVar20);
          }
        }
        else if (pVar10 != 0) {
          lVar20 = 0;
          do {
            bVar9 = pbVar31[lVar20 * 4 + 4];
            if (bVar9 == 0) {
              pbVar15[lVar20 * 4] = (byte)(png_ptr->background).red;
              pbVar31[lVar20 * 4 + 2] = (byte)(png_ptr->background).green;
              bVar9 = (byte)(png_ptr->background).blue;
LAB_00112f31:
              pbVar31[lVar20 * 4 + 3] = bVar9;
            }
            else {
              uVar42 = (uint)bVar9;
              if (uVar42 == 0xff) {
                pbVar15[lVar20 * 4] = ppVar18[pbVar15[lVar20 * 4]];
                pbVar31[lVar20 * 4 + 2] = ppVar18[pbVar31[lVar20 * 4 + 2]];
                bVar9 = ppVar18[pbVar31[lVar20 * 4 + 3]];
                goto LAB_00112f31;
              }
              bVar36 = ~bVar9;
              iVar38 = (uint)(png_ptr->background_1).red * (uint)bVar36;
              bVar34 = (byte)((iVar38 + ppVar39[pbVar15[lVar20 * 4]] * uVar42 + 0x80 >> 8 & 0xff) +
                              ppVar39[pbVar15[lVar20 * 4]] * uVar42 + iVar38 + 0x80 >> 8);
              if ((uVar27 >> 0xd & 1) == 0) {
                bVar34 = ppVar11[bVar34];
              }
              pbVar15[lVar20 * 4] = bVar34;
              iVar38 = (uint)(png_ptr->background_1).green * (uint)bVar36;
              bVar34 = (byte)((iVar38 + ppVar39[pbVar31[lVar20 * 4 + 2]] * uVar42 + 0x80 >> 8 & 0xff
                              ) + ppVar39[pbVar31[lVar20 * 4 + 2]] * uVar42 + iVar38 + 0x80 >> 8);
              if ((uVar27 >> 0xd & 1) == 0) {
                bVar34 = ppVar11[bVar34];
              }
              pbVar31[lVar20 * 4 + 2] = bVar34;
              iVar38 = (uint)(png_ptr->background_1).blue * (uint)bVar36;
              bVar9 = (byte)(((uint)ppVar39[pbVar31[lVar20 * 4 + 3]] * (uint)bVar9 + iVar38 + 0x80
                              >> 8 & 0xff) +
                             (uint)ppVar39[pbVar31[lVar20 * 4 + 3]] * (uint)bVar9 + iVar38 + 0x80 >>
                            8);
              if ((uVar27 >> 0xd & 1) == 0) {
                bVar9 = ppVar11[bVar9];
              }
              pbVar31[lVar20 * 4 + 3] = bVar9;
            }
            lVar20 = lVar20 + 1;
          } while (pVar10 != (png_uint_32)lVar20);
        }
      }
      else if ((pppVar4 == (png_uint_16pp)0x0 || pppVar17 == (png_uint_16pp)0x0) ||
               pppVar5 == (png_uint_16pp)0x0) {
        if (pVar10 != 0) {
          lVar20 = 0;
          do {
            uVar19 = *(ushort *)(pbVar31 + lVar20 * 8 + 7) << 8 |
                     *(ushort *)(pbVar31 + lVar20 * 8 + 7) >> 8;
            if (uVar19 != 0xffff) {
              if (uVar19 == 0) {
                pVar23 = (png_ptr->background).red;
                pbVar15[lVar20 * 8] = (byte)(pVar23 >> 8);
                pbVar31[lVar20 * 8 + 2] = (byte)pVar23;
                uVar19 = (png_ptr->background).green;
                *(ushort *)(pbVar31 + lVar20 * 8 + 3) = uVar19 << 8 | uVar19 >> 8;
                uVar19 = (png_ptr->background).blue;
                *(ushort *)(pbVar31 + lVar20 * 8 + 5) = uVar19 << 8 | uVar19 >> 8;
              }
              else {
                uVar22 = *(ushort *)(pbVar31 + lVar20 * 8 + 3);
                uVar30 = *(ushort *)(pbVar31 + lVar20 * 8 + 5);
                uVar27 = (uint)uVar19;
                uVar42 = uVar27 ^ 0xffff;
                iVar38 = (png_ptr->background).red * uVar42 +
                         (((*(ushort *)(pbVar15 + lVar20 * 8) & 0xff00) << 8 |
                          (uint)*(ushort *)(pbVar15 + lVar20 * 8) << 0x18) >> 0x10) * uVar27;
                iVar38 = (iVar38 + 0x8000U >> 0x10) + iVar38 + 0x8000;
                pbVar15[lVar20 * 8] = (byte)((uint)iVar38 >> 0x18);
                pbVar31[lVar20 * 8 + 2] = (byte)((uint)iVar38 >> 0x10);
                iVar38 = (png_ptr->background).green * uVar42 +
                         (ushort)(uVar22 << 8 | uVar22 >> 8) * uVar27;
                iVar38 = (iVar38 + 0x8000U >> 0x10) + iVar38 + 0x8000;
                pbVar31[lVar20 * 8 + 3] = (byte)((uint)iVar38 >> 0x18);
                pbVar31[lVar20 * 8 + 4] = (byte)((uint)iVar38 >> 0x10);
                iVar38 = (png_ptr->background).blue * uVar42 +
                         (ushort)(uVar30 << 8 | uVar30 >> 8) * uVar27;
                iVar38 = iVar38 + (iVar38 + 0x8000U >> 0x10) + 0x8000;
                pbVar31[lVar20 * 8 + 5] = (byte)((uint)iVar38 >> 0x18);
                pbVar31[lVar20 * 8 + 6] = (byte)((uint)iVar38 >> 0x10);
              }
            }
            lVar20 = lVar20 + 1;
          } while (pVar10 != (png_uint_32)lVar20);
        }
      }
      else if (pVar10 != 0) {
        lVar20 = 0;
        do {
          uVar19 = *(ushort *)(pbVar31 + lVar20 * 8 + 7) << 8 |
                   *(ushort *)(pbVar31 + lVar20 * 8 + 7) >> 8;
          if (uVar19 == 0) {
            pVar23 = (png_ptr->background).red;
            pbVar15[lVar20 * 8] = (byte)(pVar23 >> 8);
            pbVar31[lVar20 * 8 + 2] = (byte)pVar23;
            uVar19 = (png_ptr->background).green;
            *(ushort *)(pbVar31 + lVar20 * 8 + 3) = uVar19 << 8 | uVar19 >> 8;
            uVar19 = (png_ptr->background).blue;
LAB_001137e4:
            *(ushort *)(pbVar31 + lVar20 * 8 + 5) = uVar19 << 8 | uVar19 >> 8;
          }
          else {
            if (uVar19 == 0xffff) {
              pVar23 = pppVar17[pbVar31[lVar20 * 8 + 2] >> (bVar9 & 0x1f)][pbVar15[lVar20 * 8]];
              pbVar15[lVar20 * 8] = (byte)(pVar23 >> 8);
              pbVar31[lVar20 * 8 + 2] = (byte)pVar23;
              *(png_uint_16 *)(pbVar31 + lVar20 * 8 + 3) =
                   pppVar17[pbVar31[lVar20 * 8 + 4] >> (bVar9 & 0x1f)][pbVar31[lVar20 * 8 + 3]] << 8
                   | pppVar17[pbVar31[lVar20 * 8 + 4] >> (bVar9 & 0x1f)][pbVar31[lVar20 * 8 + 3]] >>
                     8;
              uVar19 = pppVar17[pbVar31[lVar20 * 8 + 6] >> (bVar9 & 0x1f)][pbVar31[lVar20 * 8 + 5]];
              goto LAB_001137e4;
            }
            iVar38 = (uint)pppVar5[pbVar31[lVar20 * 8 + 2] >> (bVar9 & 0x1f)][pbVar15[lVar20 * 8]] *
                     (uint)uVar19;
            uVar24 = (uint)uVar19;
            uVar41 = uVar24 ^ 0xffff;
            iVar44 = (png_ptr->background_1).red * uVar41;
            uVar42 = iVar38 + iVar44 + (iVar38 + iVar44 + 0x8000U >> 0x10) + 0x8000;
            pVar23 = (png_uint_16)(uVar42 >> 0x10);
            if ((uVar27 >> 0xd & 1) == 0) {
              pVar23 = pppVar4[(uVar42 >> 0x10 & 0xff) >> (bVar9 & 0x1f)][uVar42 >> 0x18];
            }
            *(png_uint_16 *)(pbVar15 + lVar20 * 8) = pVar23 << 8 | pVar23 >> 8;
            iVar38 = (png_ptr->background_1).green * uVar41;
            uVar42 = pppVar5[pbVar31[lVar20 * 8 + 4] >> (bVar9 & 0x1f)][pbVar31[lVar20 * 8 + 3]] *
                     uVar24 + iVar38 +
                     (pppVar5[pbVar31[lVar20 * 8 + 4] >> (bVar9 & 0x1f)][pbVar31[lVar20 * 8 + 3]] *
                      uVar24 + iVar38 + 0x8000 >> 0x10) + 0x8000;
            pVar23 = (png_uint_16)(uVar42 >> 0x10);
            if ((uVar27 >> 0xd & 1) == 0) {
              pVar23 = pppVar4[(uVar42 >> 0x10 & 0xff) >> (bVar9 & 0x1f)][uVar42 >> 0x18];
            }
            *(png_uint_16 *)(pbVar31 + lVar20 * 8 + 3) = pVar23 << 8 | pVar23 >> 8;
            iVar38 = uVar41 * (png_ptr->background_1).blue;
            uVar42 = (uVar24 * pppVar5[pbVar31[lVar20 * 8 + 6] >> (bVar9 & 0x1f)]
                               [pbVar31[lVar20 * 8 + 5]] + iVar38 + 0x8000 >> 0x10) +
                     uVar24 * pppVar5[pbVar31[lVar20 * 8 + 6] >> (bVar9 & 0x1f)]
                              [pbVar31[lVar20 * 8 + 5]] + iVar38 + 0x8000;
            pVar23 = (png_uint_16)(uVar42 >> 0x10);
            if ((uVar27 >> 0xd & 1) == 0) {
              pVar23 = pppVar4[(uVar42 >> 0x10 & 0xff) >> (bVar9 & 0x1f)][uVar42 >> 0x18];
            }
            *(png_uint_16 *)(pbVar31 + lVar20 * 8 + 5) = pVar23 << 8 | pVar23 >> 8;
          }
          lVar20 = lVar20 + 1;
        } while (pVar10 != (png_uint_32)lVar20);
      }
    }
  }
  if (((png_ptr->transformations & 0x602000) == 0x2000) &&
     (((-1 < (char)png_ptr->transformations ||
       ((png_ptr->num_trans == 0 && ((png_ptr->color_type & 4) == 0)))) &&
      (png_ptr->color_type != '\x03')))) {
    pbVar15 = png_ptr->row_buf;
    ppVar18 = png_ptr->gamma_table;
    pppVar17 = png_ptr->gamma_16_table;
    uVar27 = row_info->width;
    bVar9 = row_info->bit_depth;
    if (((bVar9 < 9 && ppVar18 != (png_bytep)0x0) ||
        (pppVar17 != (png_uint_16pp)0x0 && bVar9 == 0x10)) && (row_info->color_type < 7)) {
      pbVar31 = pbVar15 + 1;
      bVar34 = (byte)png_ptr->gamma_shift;
      switch(row_info->color_type) {
      case '\0':
        local_50 = row_info;
        if (uVar27 != 0 && bVar9 == 2) {
          uVar42 = 0;
          pbVar40 = pbVar31;
          do {
            bVar9 = *pbVar40;
            uVar41 = bVar9 & 0xffffffc0;
            uVar24 = bVar9 & 0x30;
            uVar43 = bVar9 & 0xc;
            *pbVar40 = ppVar18[(ulong)(bVar9 & 3) * 0x55] >> 6 |
                       ppVar18[uVar43 >> 2 | uVar43 * 0x14 | uVar43] >> 4 & 0xc |
                       ppVar18[uVar24 >> 4 | (uVar24 >> 2) + uVar24 * 4 | uVar24] >> 2 & 0x30 |
                       ppVar18[(uint)(bVar9 >> 6) | uVar41 >> 4 | uVar41 >> 2 | uVar41] & 0xc0;
            pbVar40 = pbVar40 + 1;
            uVar42 = uVar42 + 4;
          } while (uVar42 < uVar27);
        }
        pVar12 = row_info->bit_depth;
        if (pVar12 == '\x04') {
          if (uVar27 != 0) {
            uVar42 = 0;
            do {
              bVar9 = *pbVar31;
              uVar24 = bVar9 & 0xf;
              *pbVar31 = ppVar18[uVar24 << 4 | uVar24] >> 4 |
                         ppVar18[(ulong)(bVar9 >> 4) | (ulong)(bVar9 & 0xfffffff0)] & 0xf0;
              pbVar31 = pbVar31 + 1;
              uVar42 = uVar42 + 2;
            } while (uVar42 < uVar27);
          }
        }
        else if (pVar12 == '\b') {
          if (uVar27 != 0) {
            lVar20 = 0;
            do {
              pbVar31[lVar20] = ppVar18[pbVar31[lVar20]];
              lVar20 = lVar20 + 1;
            } while (uVar27 != (uint)lVar20);
          }
        }
        else if ((pVar12 == '\x10') && (uVar27 != 0)) {
          lVar20 = 0;
          do {
            *(png_uint_16 *)(pbVar15 + lVar20 * 2 + 1) =
                 pppVar17[pbVar15[lVar20 * 2 + 2] >> (bVar34 & 0x1f)][pbVar15[lVar20 * 2 + 1]] << 8
                 | pppVar17[pbVar15[lVar20 * 2 + 2] >> (bVar34 & 0x1f)][pbVar15[lVar20 * 2 + 1]] >>
                   8;
            lVar20 = lVar20 + 1;
          } while (uVar27 != (uint)lVar20);
        }
        break;
      case '\x02':
        if (bVar9 == 8) {
          for (; uVar27 != 0; uVar27 = uVar27 - 1) {
            *pbVar31 = ppVar18[*pbVar31];
            pbVar31[1] = ppVar18[pbVar31[1]];
            pbVar31[2] = ppVar18[pbVar31[2]];
            pbVar31 = pbVar31 + 3;
          }
        }
        else {
          for (; uVar27 != 0; uVar27 = uVar27 - 1) {
            *(png_uint_16 *)(pbVar15 + 1) =
                 pppVar17[pbVar15[2] >> (bVar34 & 0x1f)][pbVar15[1]] << 8 |
                 pppVar17[pbVar15[2] >> (bVar34 & 0x1f)][pbVar15[1]] >> 8;
            *(png_uint_16 *)(pbVar15 + 3) =
                 pppVar17[pbVar15[4] >> (bVar34 & 0x1f)][pbVar15[3]] << 8 |
                 pppVar17[pbVar15[4] >> (bVar34 & 0x1f)][pbVar15[3]] >> 8;
            *(png_uint_16 *)(pbVar15 + 5) =
                 pppVar17[pbVar15[6] >> (bVar34 & 0x1f)][pbVar15[5]] << 8 |
                 pppVar17[pbVar15[6] >> (bVar34 & 0x1f)][pbVar15[5]] >> 8;
            pbVar15 = pbVar15 + 6;
          }
        }
        break;
      case '\x04':
        if (bVar9 == 8) {
          if (uVar27 != 0) {
            lVar20 = 0;
            do {
              pbVar31[lVar20 * 2] = ppVar18[pbVar31[lVar20 * 2]];
              lVar20 = lVar20 + 1;
            } while (uVar27 != (uint)lVar20);
          }
        }
        else if (uVar27 != 0) {
          lVar20 = 0;
          do {
            *(png_uint_16 *)(pbVar15 + lVar20 * 4 + 1) =
                 pppVar17[pbVar15[lVar20 * 4 + 2] >> (bVar34 & 0x1f)][pbVar15[lVar20 * 4 + 1]] << 8
                 | pppVar17[pbVar15[lVar20 * 4 + 2] >> (bVar34 & 0x1f)][pbVar15[lVar20 * 4 + 1]] >>
                   8;
            lVar20 = lVar20 + 1;
          } while (uVar27 != (uint)lVar20);
        }
        break;
      case '\x06':
        if (bVar9 == 8) {
          if (uVar27 != 0) {
            lVar20 = 0;
            do {
              pbVar31[lVar20 * 4] = ppVar18[pbVar31[lVar20 * 4]];
              pbVar15[lVar20 * 4 + 2] = ppVar18[pbVar15[lVar20 * 4 + 2]];
              pbVar15[lVar20 * 4 + 3] = ppVar18[pbVar15[lVar20 * 4 + 3]];
              lVar20 = lVar20 + 1;
            } while (uVar27 != (uint)lVar20);
          }
        }
        else if (uVar27 != 0) {
          lVar20 = 0;
          do {
            *(png_uint_16 *)(pbVar15 + lVar20 * 8 + 1) =
                 pppVar17[pbVar15[lVar20 * 8 + 2] >> (bVar34 & 0x1f)][pbVar15[lVar20 * 8 + 1]] << 8
                 | pppVar17[pbVar15[lVar20 * 8 + 2] >> (bVar34 & 0x1f)][pbVar15[lVar20 * 8 + 1]] >>
                   8;
            *(png_uint_16 *)(pbVar15 + lVar20 * 8 + 3) =
                 pppVar17[pbVar15[lVar20 * 8 + 4] >> (bVar34 & 0x1f)][pbVar15[lVar20 * 8 + 3]] << 8
                 | pppVar17[pbVar15[lVar20 * 8 + 4] >> (bVar34 & 0x1f)][pbVar15[lVar20 * 8 + 3]] >>
                   8;
            *(png_uint_16 *)(pbVar15 + lVar20 * 8 + 5) =
                 pppVar17[pbVar15[lVar20 * 8 + 6] >> (bVar34 & 0x1f)][pbVar15[lVar20 * 8 + 5]] << 8
                 | pppVar17[pbVar15[lVar20 * 8 + 6] >> (bVar34 & 0x1f)][pbVar15[lVar20 * 8 + 5]] >>
                   8;
            lVar20 = lVar20 + 1;
          } while (uVar27 != (uint)lVar20);
        }
      }
    }
  }
  if (((~png_ptr->transformations & 0x40080) == 0) && ((row_info->color_type | 2) == 6)) {
    png_do_strip_channel(row_info,png_ptr->row_buf + 1,0);
  }
  if (((png_ptr->transformations & 0x800000) != 0) &&
     (bVar9 = row_info->color_type, (bVar9 & 4) != 0)) {
    pbVar15 = png_ptr->row_buf;
    pVar10 = row_info->width;
    if (row_info->bit_depth == '\x10') {
      pppVar17 = png_ptr->gamma_16_from_1;
      if (pppVar17 == (png_uint_16pp)0x0) goto LAB_00113085;
      if (pVar10 != 0) {
        iVar38 = png_ptr->gamma_shift;
        do {
          pbVar15 = pbVar15 + (ulong)(bVar9 & 2) * 2 + 4;
          uVar19 = pppVar17[*pbVar15 >> ((byte)iVar38 & 0x1f)][pbVar15[-1]];
          *(ushort *)(pbVar15 + -1) = uVar19 << 8 | uVar19 >> 8;
          pVar10 = pVar10 - 1;
        } while (pVar10 != 0);
      }
    }
    else if ((row_info->bit_depth == '\b') &&
            (ppVar18 = png_ptr->gamma_from_1, ppVar18 != (png_bytep)0x0)) {
      if (pVar10 != 0) {
        do {
          pbVar15 = pbVar15 + (ulong)(bVar9 & 2) + 2;
          *pbVar15 = ppVar18[*pbVar15];
          pVar10 = pVar10 - 1;
        } while (pVar10 != 0);
      }
    }
    else {
LAB_00113085:
      png_warning(png_ptr,"png_do_encode_alpha: unexpected call");
    }
  }
  if (((png_ptr->transformations & 0x4000000) != 0) && (row_info->bit_depth == '\x10')) {
    sVar6 = row_info->rowbytes;
    if (0 < (long)sVar6) {
      ppVar18 = png_ptr->row_buf;
      lVar20 = 0;
      do {
        pbVar15 = ppVar18 + lVar20 * 2 + 1;
        ppVar18[lVar20 + 1] =
             (char)(((uint)pbVar15[1] - (uint)*pbVar15) * 0xffff + 0x7fff80 >> 0x18) + *pbVar15;
        lVar20 = lVar20 + 1;
      } while (pbVar15 + 2 < ppVar18 + sVar6 + 1);
    }
    row_info->bit_depth = '\b';
    row_info->pixel_depth = row_info->channels * '\b';
    row_info->rowbytes = (ulong)((uint)row_info->channels * row_info->width);
  }
  if (((png_ptr->transformations & 0x400) != 0) && (row_info->bit_depth == '\x10')) {
    sVar6 = row_info->rowbytes;
    if (0 < (long)sVar6) {
      ppVar18 = png_ptr->row_buf;
      ppVar11 = ppVar18 + 1;
      ppVar21 = ppVar11;
      do {
        *ppVar21 = *ppVar11;
        ppVar21 = ppVar21 + 1;
        ppVar11 = ppVar11 + 2;
      } while (ppVar11 < ppVar18 + sVar6 + 1);
    }
    row_info->bit_depth = '\b';
    row_info->pixel_depth = row_info->channels * '\b';
    row_info->rowbytes = (ulong)((uint)row_info->channels * row_info->width);
  }
  if ((png_ptr->transformations & 0x40) != 0) {
    if (row_info->bit_depth == '\b') {
      ppVar18 = png_ptr->row_buf;
      ppVar11 = png_ptr->palette_lookup;
      pbVar15 = ppVar18 + 1;
      uVar27 = row_info->width;
      uVar16 = (ulong)uVar27;
      pVar12 = row_info->color_type;
      if (ppVar11 == (png_bytep)0x0 || pVar12 != '\x02') {
        if (pVar12 != '\x06' || ppVar11 == (png_bytep)0x0) {
          ppVar18 = png_ptr->quantize_index;
          if ((uVar27 != 0 && ppVar18 != (png_bytep)0x0) && pVar12 == '\x03') {
            lVar20 = 0;
            do {
              pbVar15[lVar20] = ppVar18[pbVar15[lVar20]];
              lVar20 = lVar20 + 1;
            } while (uVar27 != (uint)lVar20);
          }
          goto LAB_0011328c;
        }
        if (uVar16 != 0) {
          lVar20 = 0;
          do {
            pbVar15[lVar20] =
                 ppVar11[(uint)(ppVar18[lVar20 * 4 + 3] >> 3) |
                         (pbVar15[lVar20 * 4] & 0xf8) * 0x80 +
                         (ppVar18[lVar20 * 4 + 2] & 0xfffffff8) * 4];
            lVar20 = lVar20 + 1;
          } while (uVar27 != (uint)lVar20);
        }
      }
      else if (uVar16 != 0) {
        lVar20 = 0;
        pbVar31 = pbVar15;
        do {
          pbVar15[lVar20] =
               ppVar11[(uint)(pbVar31[2] >> 3) |
                       (*pbVar31 & 0xf8) * 0x80 + (pbVar31[1] & 0xfffffff8) * 4];
          lVar20 = lVar20 + 1;
          pbVar31 = pbVar31 + 3;
        } while (uVar27 != (uint)lVar20);
      }
      row_info->color_type = '\x03';
      row_info->channels = '\x01';
      bVar9 = row_info->bit_depth;
      row_info->pixel_depth = bVar9;
      if ((ulong)bVar9 < 8) {
        uVar16 = bVar9 * uVar16 + 7 >> 3;
      }
      else {
        uVar16 = (bVar9 >> 3) * uVar16;
      }
      row_info->rowbytes = uVar16;
    }
LAB_0011328c:
    if (row_info->rowbytes == 0) {
      error_message = "png_do_quantize returned rowbytes=0";
LAB_001149ac:
      png_error(png_ptr,error_message);
    }
  }
  if ((((png_ptr->transformations & 0x200) != 0) && (row_info->bit_depth == '\b')) &&
     (row_info->color_type != '\x03')) {
    sVar6 = row_info->rowbytes;
    if (0 < (long)sVar6) {
      ppVar18 = png_ptr->row_buf + sVar6 * 2 + 1;
      ppVar21 = png_ptr->row_buf + sVar6;
      do {
        pVar12 = *ppVar21;
        ppVar18[-1] = pVar12;
        ppVar18[-2] = pVar12;
        ppVar18 = ppVar18 + -2;
        bVar46 = ppVar21 < ppVar18;
        ppVar21 = ppVar21 + -1;
      } while (bVar46);
    }
    row_info->rowbytes = row_info->rowbytes << 1;
    row_info->bit_depth = '\x10';
    row_info->pixel_depth = row_info->channels << 4;
  }
  if (((png_ptr->transformations & 0x4000) != 0) && ((png_ptr->mode & 0x800) != 0)) {
    png_do_gray_to_rgb(row_info,png_ptr->row_buf + 1);
  }
  if ((png_ptr->transformations & 0x20) != 0) {
    png_do_invert(row_info,png_ptr->row_buf + 1);
  }
  if ((png_ptr->transformations & 0x80000) != 0) {
    ppVar18 = png_ptr->row_buf;
    pVar10 = row_info->width;
    if (row_info->color_type == '\x04') {
      if (row_info->bit_depth == '\b') {
        if (pVar10 != 0) {
          pbVar15 = ppVar18 + row_info->rowbytes;
          do {
            *pbVar15 = ~*pbVar15;
            pbVar15 = pbVar15 + -2;
            pVar10 = pVar10 - 1;
          } while (pVar10 != 0);
        }
      }
      else if (pVar10 != 0) {
        pbVar15 = ppVar18 + row_info->rowbytes;
        do {
          *pbVar15 = ~*pbVar15;
          pbVar15[-1] = ~pbVar15[-1];
          pbVar15 = pbVar15 + -4;
          pVar10 = pVar10 - 1;
        } while (pVar10 != 0);
      }
    }
    else if (row_info->color_type == '\x06') {
      if (row_info->bit_depth == '\b') {
        if (pVar10 != 0) {
          pbVar15 = ppVar18 + row_info->rowbytes;
          do {
            *pbVar15 = ~*pbVar15;
            pbVar15 = pbVar15 + -4;
            pVar10 = pVar10 - 1;
          } while (pVar10 != 0);
        }
      }
      else if (pVar10 != 0) {
        pbVar15 = ppVar18 + row_info->rowbytes;
        do {
          *pbVar15 = ~*pbVar15;
          pbVar15[-1] = ~pbVar15[-1];
          pbVar15 = pbVar15 + -8;
          pVar10 = pVar10 - 1;
        } while (pVar10 != 0);
      }
    }
  }
  if (((png_ptr->transformations & 8) != 0) && (bVar9 = row_info->color_type, bVar9 != 3)) {
    uVar27 = (uint)row_info->bit_depth;
    if ((bVar9 & 2) == 0) {
      local_68[0] = uVar27 - (png_ptr->shift).gray;
      uVar16 = 1;
    }
    else {
      local_68[0] = uVar27 - (png_ptr->shift).red;
      local_68[1] = uVar27 - (png_ptr->shift).green;
      local_68[2] = uVar27 - (png_ptr->shift).blue;
      uVar16 = 3;
    }
    ppVar18 = png_ptr->row_buf;
    uVar25 = uVar16;
    if ((bVar9 & 4) != 0) {
      uVar25 = (ulong)((int)uVar16 + 1);
      local_68[uVar16] = uVar27 - (png_ptr->shift).alpha;
    }
    puVar28 = (ushort *)(ppVar18 + 1);
    uVar16 = 0;
    bVar46 = false;
    do {
      iVar38 = local_68[uVar16];
      bVar8 = iVar38 < 1;
      bVar7 = (int)uVar27 <= iVar38;
      if (bVar8 || bVar7) {
        iVar38 = 0;
      }
      local_68[uVar16] = iVar38;
      if (!bVar8 && !bVar7) {
        bVar46 = true;
      }
      uVar16 = uVar16 + 1;
    } while (uVar25 != uVar16);
    if (bVar46) {
      switch(uVar27 - 2 >> 1 | (uint)((uVar27 - 2 & 1) != 0) << 0x1f) {
      case 0:
        if (0 < (long)row_info->rowbytes) {
          puVar45 = (ushort *)(row_info->rowbytes + (long)puVar28);
          do {
            *(byte *)puVar28 = (byte)*puVar28 >> 1 & 0x55;
            puVar28 = (ushort *)((long)puVar28 + 1);
          } while (puVar28 < puVar45);
        }
        break;
      case 1:
        uVar27 = 0xf >> ((byte)local_68[0] & 0x1f);
        if (0 < (long)row_info->rowbytes) {
          puVar45 = (ushort *)(row_info->rowbytes + (long)puVar28);
          do {
            *(byte *)puVar28 =
                 (byte)*puVar28 >> ((byte)local_68[0] & 0x1f) & ((byte)(uVar27 << 4) | (byte)uVar27)
            ;
            puVar28 = (ushort *)((long)puVar28 + 1);
          } while (puVar28 < puVar45);
        }
        break;
      case 3:
        if (0 < (long)row_info->rowbytes) {
          puVar45 = (ushort *)(row_info->rowbytes + (long)puVar28);
          iVar38 = 0;
          do {
            lVar20 = (long)iVar38;
            iVar38 = iVar38 + 1;
            if ((int)uVar25 <= iVar38) {
              iVar38 = 0;
            }
            *(byte *)puVar28 = (byte)*puVar28 >> (*(byte *)(local_68 + lVar20) & 0x1f);
            puVar28 = (ushort *)((long)puVar28 + 1);
          } while (puVar28 < puVar45);
        }
        break;
      case 7:
        if (0 < (long)row_info->rowbytes) {
          puVar45 = (ushort *)(row_info->rowbytes + (long)puVar28);
          iVar38 = 0;
          do {
            uVar19 = (ushort)(*puVar28 << 8 | *puVar28 >> 8) >>
                     (*(byte *)(local_68 + iVar38) & 0x1f);
            iVar38 = iVar38 + 1;
            if ((int)uVar25 <= iVar38) {
              iVar38 = 0;
            }
            *puVar28 = uVar19 << 8 | uVar19 >> 8;
            puVar28 = puVar28 + 1;
          } while (puVar28 < puVar45);
        }
      }
    }
  }
  if (((png_ptr->transformations & 4) != 0) && (bVar9 = row_info->bit_depth, bVar9 < 8)) {
    ppVar18 = png_ptr->row_buf;
    uVar27 = row_info->width;
    uVar16 = (ulong)uVar27;
    if (bVar9 == 4) {
      if (uVar27 != 0) {
        uVar42 = uVar27 * 4 & 4;
        pbVar31 = ppVar18 + (ulong)(uVar27 - 1 >> 1) + 1;
        pbVar15 = ppVar18 + uVar16;
        do {
          *pbVar15 = *pbVar31 >> (sbyte)uVar42 & 0xf;
          pbVar31 = pbVar31 + -(ulong)(uVar42 != 0);
          uVar42 = (uint)(uVar42 == 0) << 2;
          pbVar15 = pbVar15 + -1;
          uVar24 = (int)uVar16 - 1;
          uVar16 = (ulong)uVar24;
        } while (uVar24 != 0);
      }
    }
    else if (bVar9 == 2) {
      if (uVar27 != 0) {
        uVar42 = ~(uVar27 * 2 + 6) & 6;
        pbVar31 = ppVar18 + (ulong)(uVar27 - 1 >> 2) + 1;
        pbVar15 = ppVar18 + uVar16;
        do {
          *pbVar15 = *pbVar31 >> ((byte)uVar42 & 0x1f) & 3;
          bVar46 = uVar42 == 6;
          uVar42 = uVar42 + 2;
          if (bVar46) {
            uVar42 = 0;
          }
          pbVar31 = pbVar31 + -(ulong)bVar46;
          pbVar15 = pbVar15 + -1;
          uVar24 = (int)uVar16 - 1;
          uVar16 = (ulong)uVar24;
        } while (uVar24 != 0);
      }
    }
    else if ((bVar9 == 1) && (uVar27 != 0)) {
      uVar42 = -uVar27 & 7;
      pbVar15 = ppVar18 + (ulong)(uVar27 - 1 >> 3) + 1;
      ppVar18 = ppVar18 + uVar16;
      do {
        *ppVar18 = (*pbVar15 >> (uVar42 & 0x1f) & 1) != 0;
        bVar46 = uVar42 == 7;
        uVar42 = uVar42 + 1;
        if (bVar46) {
          uVar42 = 0;
        }
        pbVar15 = pbVar15 + -(ulong)bVar46;
        ppVar18 = ppVar18 + -1;
        uVar24 = (int)uVar16 - 1;
        uVar16 = (ulong)uVar24;
      } while (uVar24 != 0);
    }
    row_info->bit_depth = '\b';
    row_info->pixel_depth = row_info->channels * '\b';
    row_info->rowbytes = (ulong)(uVar27 * row_info->channels);
  }
  if ((row_info->color_type == '\x03') && (-1 < png_ptr->num_palette_max)) {
    png_do_check_palette_indexes(png_ptr,row_info);
  }
  if ((png_ptr->transformations & 1) != 0) {
    png_do_bgr(row_info,png_ptr->row_buf + 1);
  }
  if ((png_ptr->transformations & 0x10000) != 0) {
    png_do_packswap(row_info,png_ptr->row_buf + 1);
  }
  if ((png_ptr->transformations & 0x8000) == 0) goto LAB_00113ea4;
  ppVar18 = png_ptr->row_buf;
  uVar27 = row_info->width;
  uVar16 = (ulong)uVar27;
  cVar32 = (char)png_ptr->flags;
  pVar29 = (png_byte)(png_ptr->filler >> 8);
  pVar12 = (png_byte)png_ptr->filler;
  if (row_info->color_type == '\x02') {
    if (row_info->bit_depth == '\x10') {
      if (cVar32 < '\0') {
        ppVar11 = ppVar18 + uVar16 * 8 + 1;
        if (1 < uVar27) {
          ppVar21 = ppVar18 + uVar16 * 6;
          iVar38 = uVar27 - 1;
          do {
            ppVar11[-1] = pVar12;
            ppVar11[-2] = pVar29;
            ppVar11[-3] = *ppVar21;
            ppVar11[-4] = ppVar21[-1];
            ppVar11[-5] = ppVar21[-2];
            ppVar11[-6] = ppVar21[-3];
            ppVar11[-7] = ppVar21[-4];
            ppVar11[-8] = ppVar21[-5];
            ppVar11 = ppVar11 + -8;
            ppVar21 = ppVar21 + -6;
            iVar38 = iVar38 + -1;
          } while (iVar38 != 0);
        }
        ppVar11[-1] = pVar12;
        ppVar11[-2] = pVar29;
        sVar13 = 3;
        pVar33 = '@';
LAB_00113e93:
        pVar37 = '\x04';
      }
      else {
        sVar13 = 3;
        pVar33 = '@';
        pVar37 = '\x04';
        if (uVar27 != 0) {
          ppVar11 = ppVar18 + uVar16 * 8;
          ppVar21 = ppVar18 + uVar16 * 6;
          do {
            *ppVar11 = *ppVar21;
            ppVar11[-1] = ppVar21[-1];
            ppVar11[-2] = ppVar21[-2];
            ppVar11[-3] = ppVar21[-3];
            ppVar11[-4] = ppVar21[-4];
            ppVar11[-5] = ppVar21[-5];
            ppVar11[-6] = pVar12;
            ppVar11[-7] = pVar29;
            ppVar11 = ppVar11 + -8;
            ppVar21 = ppVar21 + -6;
            uVar42 = (int)uVar16 - 1;
            uVar16 = (ulong)uVar42;
          } while (uVar42 != 0);
        }
      }
    }
    else {
      if (row_info->bit_depth != '\b') goto LAB_00113ea4;
      if (cVar32 < '\0') {
        ppVar11 = ppVar18 + uVar16 * 4 + 1;
        if (1 < uVar27) {
          ppVar21 = ppVar18 + uVar16 * 3;
          iVar38 = uVar27 - 1;
          do {
            ppVar11[-1] = pVar12;
            ppVar11[-2] = *ppVar21;
            ppVar11[-3] = ppVar21[-1];
            ppVar11[-4] = ppVar21[-2];
            ppVar11 = ppVar11 + -4;
            ppVar21 = ppVar21 + -3;
            iVar38 = iVar38 + -1;
          } while (iVar38 != 0);
        }
        ppVar11[-1] = pVar12;
        sVar13 = 2;
        pVar33 = ' ';
        goto LAB_00113e93;
      }
      sVar13 = 2;
      pVar33 = ' ';
      pVar37 = '\x04';
      if (uVar27 != 0) {
        ppVar11 = ppVar18 + uVar16 * 4;
        ppVar21 = ppVar18 + uVar16 * 3;
        do {
          *ppVar11 = *ppVar21;
          ppVar11[-1] = ppVar21[-1];
          ppVar11[-2] = ppVar21[-2];
          ppVar11[-3] = pVar12;
          ppVar11 = ppVar11 + -4;
          ppVar21 = ppVar21 + -3;
          uVar42 = (int)uVar16 - 1;
          uVar16 = (ulong)uVar42;
        } while (uVar42 != 0);
      }
    }
  }
  else {
    if (row_info->color_type != '\0') goto LAB_00113ea4;
    if (row_info->bit_depth == '\x10') {
      if (cVar32 < '\0') {
        ppVar11 = ppVar18 + uVar16 * 4 + 1;
        if (1 < uVar27) {
          ppVar21 = ppVar18 + uVar16 * 2;
          iVar38 = uVar27 - 1;
          do {
            ppVar11[-1] = pVar12;
            ppVar11[-2] = pVar29;
            ppVar11[-3] = *ppVar21;
            ppVar11[-4] = ppVar21[-1];
            ppVar11 = ppVar11 + -4;
            ppVar21 = ppVar21 + -2;
            iVar38 = iVar38 + -1;
          } while (iVar38 != 0);
        }
        ppVar11[-1] = pVar12;
        ppVar11[-2] = pVar29;
        sVar13 = 2;
        pVar33 = ' ';
LAB_00113e21:
        pVar37 = '\x02';
      }
      else {
        sVar13 = 2;
        pVar33 = ' ';
        pVar37 = '\x02';
        uVar42 = uVar27;
        while (uVar42 != 0) {
          ppVar18[uVar16 * 4] = ppVar18[uVar16 * 2];
          ppVar18[uVar16 * 4 + -1] = ppVar18[uVar16 * 2 + -1];
          ppVar18[uVar16 * 4 + -2] = pVar12;
          ppVar18[uVar16 * 4 + -3] = pVar29;
          uVar16 = uVar16 - 1;
          uVar42 = (uint)uVar16;
        }
      }
    }
    else {
      if (row_info->bit_depth != '\b') goto LAB_00113ea4;
      if (cVar32 < '\0') {
        ppVar11 = ppVar18 + uVar16 * 2 + 1;
        if (1 < uVar27) {
          ppVar21 = ppVar18 + uVar16;
          iVar38 = uVar27 - 1;
          do {
            ppVar11[-1] = pVar12;
            ppVar11[-2] = *ppVar21;
            ppVar11 = ppVar11 + -2;
            ppVar21 = ppVar21 + -1;
            iVar38 = iVar38 + -1;
          } while (iVar38 != 0);
        }
        ppVar11[-1] = pVar12;
        sVar13 = 1;
        pVar33 = '\x10';
        goto LAB_00113e21;
      }
      sVar13 = 1;
      pVar33 = '\x10';
      pVar37 = '\x02';
      uVar42 = uVar27;
      while (uVar42 != 0) {
        ppVar18[uVar16 * 2] = ppVar18[uVar16];
        ppVar18[uVar16 * 2 + -1] = pVar12;
        uVar16 = uVar16 - 1;
        uVar42 = (uint)uVar16;
      }
    }
  }
  row_info->channels = pVar37;
  row_info->pixel_depth = pVar33;
  row_info->rowbytes = (ulong)(uVar27 << sVar13);
LAB_00113ea4:
  if ((png_ptr->transformations & 0x20000) != 0) {
    ppVar18 = png_ptr->row_buf;
    pVar10 = row_info->width;
    if (row_info->color_type == '\x04') {
      if (row_info->bit_depth == '\b') {
        if (pVar10 != 0) {
          ppVar18 = ppVar18 + row_info->rowbytes;
          do {
            puVar28 = (ushort *)(ppVar18 + -1);
            *puVar28 = *puVar28 << 8 | *puVar28 >> 8;
            ppVar18 = ppVar18 + -2;
            pVar10 = pVar10 - 1;
          } while (pVar10 != 0);
        }
      }
      else if (pVar10 != 0) {
        ppVar18 = ppVar18 + row_info->rowbytes;
        do {
          puVar1 = (uint *)(ppVar18 + -3);
          *puVar1 = *puVar1 << 0x10 | *puVar1 >> 0x10;
          ppVar18 = ppVar18 + -4;
          pVar10 = pVar10 - 1;
        } while (pVar10 != 0);
      }
    }
    else if (row_info->color_type == '\x06') {
      if (row_info->bit_depth == '\b') {
        if (pVar10 != 0) {
          ppVar18 = ppVar18 + row_info->rowbytes;
          do {
            pVar12 = *ppVar18;
            *ppVar18 = ppVar18[-1];
            ppVar18[-1] = ppVar18[-2];
            ppVar18[-2] = ppVar18[-3];
            ppVar18[-3] = pVar12;
            ppVar18 = ppVar18 + -4;
            pVar10 = pVar10 - 1;
          } while (pVar10 != 0);
        }
      }
      else if (pVar10 != 0) {
        ppVar18 = ppVar18 + row_info->rowbytes;
        do {
          uVar2 = *(undefined2 *)(ppVar18 + -1);
          *(undefined2 *)(ppVar18 + -1) = *(undefined2 *)(ppVar18 + -3);
          *(undefined2 *)(ppVar18 + -3) = *(undefined2 *)(ppVar18 + -5);
          *(undefined2 *)(ppVar18 + -5) = *(undefined2 *)(ppVar18 + -7);
          *(undefined2 *)(ppVar18 + -7) = uVar2;
          ppVar18 = ppVar18 + -8;
          pVar10 = pVar10 - 1;
        } while (pVar10 != 0);
      }
    }
  }
  if ((png_ptr->transformations & 0x10) != 0) {
    png_do_swap(row_info,png_ptr->row_buf + 1);
  }
  if ((png_ptr->transformations & 0x100000) != 0) {
    if (png_ptr->read_user_transform_fn != (png_user_transform_ptr)0x0) {
      (*png_ptr->read_user_transform_fn)(png_ptr,row_info,png_ptr->row_buf + 1);
    }
    if (png_ptr->user_transform_depth != '\0') {
      row_info->bit_depth = png_ptr->user_transform_depth;
    }
    if (png_ptr->user_transform_channels != '\0') {
      row_info->channels = png_ptr->user_transform_channels;
    }
    bVar9 = row_info->channels * row_info->bit_depth;
    row_info->pixel_depth = bVar9;
    if (bVar9 < 8) {
      uVar16 = (ulong)row_info->width * (ulong)bVar9 + 7 >> 3;
    }
    else {
      uVar16 = (ulong)row_info->width * (ulong)(bVar9 >> 3);
    }
    row_info->rowbytes = uVar16;
  }
  return;
}

Assistant:

void /* PRIVATE */
png_do_read_transformations(png_structrp png_ptr, png_row_infop row_info)
{
   png_debug(1, "in png_do_read_transformations");

   if (png_ptr->row_buf == NULL)
   {
      /* Prior to 1.5.4 this output row/pass where the NULL pointer is, but this
       * error is incredibly rare and incredibly easy to debug without this
       * information.
       */
      png_error(png_ptr, "NULL row buffer");
   }

   /* The following is debugging; prior to 1.5.4 the code was never compiled in;
    * in 1.5.4 PNG_FLAG_DETECT_UNINITIALIZED was added and the macro
    * PNG_WARN_UNINITIALIZED_ROW removed.  In 1.6 the new flag is set only for
    * all transformations, however in practice the ROW_INIT always gets done on
    * demand, if necessary.
    */
   if ((png_ptr->flags & PNG_FLAG_DETECT_UNINITIALIZED) != 0 &&
       (png_ptr->flags & PNG_FLAG_ROW_INIT) == 0)
   {
      /* Application has failed to call either png_read_start_image() or
       * png_read_update_info() after setting transforms that expand pixels.
       * This check added to libpng-1.2.19 (but not enabled until 1.5.4).
       */
      png_error(png_ptr, "Uninitialized row");
   }

#ifdef PNG_READ_EXPAND_SUPPORTED
   if ((png_ptr->transformations & PNG_EXPAND) != 0)
   {
      if (row_info->color_type == PNG_COLOR_TYPE_PALETTE)
      {
#ifdef PNG_ARM_NEON_INTRINSICS_AVAILABLE
         if ((png_ptr->num_trans > 0) && (png_ptr->bit_depth == 8))
         {
            if (png_ptr->riffled_palette == NULL)
            {
               /* Initialize the accelerated palette expansion. */
               png_ptr->riffled_palette =
                   (png_bytep)png_malloc(png_ptr, 256 * 4);
               png_riffle_palette_neon(png_ptr);
            }
         }
#endif
         png_do_expand_palette(png_ptr, row_info, png_ptr->row_buf + 1,
             png_ptr->palette, png_ptr->trans_alpha, png_ptr->num_trans);
      }

      else
      {
         if (png_ptr->num_trans != 0 &&
             (png_ptr->transformations & PNG_EXPAND_tRNS) != 0)
            png_do_expand(row_info, png_ptr->row_buf + 1,
                &(png_ptr->trans_color));

         else
            png_do_expand(row_info, png_ptr->row_buf + 1, NULL);
      }
   }
#endif

#ifdef PNG_READ_STRIP_ALPHA_SUPPORTED
   if ((png_ptr->transformations & PNG_STRIP_ALPHA) != 0 &&
       (png_ptr->transformations & PNG_COMPOSE) == 0 &&
       (row_info->color_type == PNG_COLOR_TYPE_RGB_ALPHA ||
       row_info->color_type == PNG_COLOR_TYPE_GRAY_ALPHA))
      png_do_strip_channel(row_info, png_ptr->row_buf + 1,
          0 /* at_start == false, because SWAP_ALPHA happens later */);
#endif

#ifdef PNG_READ_RGB_TO_GRAY_SUPPORTED
   if ((png_ptr->transformations & PNG_RGB_TO_GRAY) != 0)
   {
      int rgb_error =
          png_do_rgb_to_gray(png_ptr, row_info,
              png_ptr->row_buf + 1);

      if (rgb_error != 0)
      {
         png_ptr->rgb_to_gray_status=1;
         if ((png_ptr->transformations & PNG_RGB_TO_GRAY) ==
             PNG_RGB_TO_GRAY_WARN)
            png_warning(png_ptr, "png_do_rgb_to_gray found nongray pixel");

         if ((png_ptr->transformations & PNG_RGB_TO_GRAY) ==
             PNG_RGB_TO_GRAY_ERR)
            png_error(png_ptr, "png_do_rgb_to_gray found nongray pixel");
      }
   }
#endif

/* From Andreas Dilger e-mail to png-implement, 26 March 1998:
 *
 *   In most cases, the "simple transparency" should be done prior to doing
 *   gray-to-RGB, or you will have to test 3x as many bytes to check if a
 *   pixel is transparent.  You would also need to make sure that the
 *   transparency information is upgraded to RGB.
 *
 *   To summarize, the current flow is:
 *   - Gray + simple transparency -> compare 1 or 2 gray bytes and composite
 *                                   with background "in place" if transparent,
 *                                   convert to RGB if necessary
 *   - Gray + alpha -> composite with gray background and remove alpha bytes,
 *                                   convert to RGB if necessary
 *
 *   To support RGB backgrounds for gray images we need:
 *   - Gray + simple transparency -> convert to RGB + simple transparency,
 *                                   compare 3 or 6 bytes and composite with
 *                                   background "in place" if transparent
 *                                   (3x compare/pixel compared to doing
 *                                   composite with gray bkgrnd)
 *   - Gray + alpha -> convert to RGB + alpha, composite with background and
 *                                   remove alpha bytes (3x float
 *                                   operations/pixel compared with composite
 *                                   on gray background)
 *
 *  Greg's change will do this.  The reason it wasn't done before is for
 *  performance, as this increases the per-pixel operations.  If we would check
 *  in advance if the background was gray or RGB, and position the gray-to-RGB
 *  transform appropriately, then it would save a lot of work/time.
 */

#ifdef PNG_READ_GRAY_TO_RGB_SUPPORTED
   /* If gray -> RGB, do so now only if background is non-gray; else do later
    * for performance reasons
    */
   if ((png_ptr->transformations & PNG_GRAY_TO_RGB) != 0 &&
       (png_ptr->mode & PNG_BACKGROUND_IS_GRAY) == 0)
      png_do_gray_to_rgb(row_info, png_ptr->row_buf + 1);
#endif

#if defined(PNG_READ_BACKGROUND_SUPPORTED) ||\
   defined(PNG_READ_ALPHA_MODE_SUPPORTED)
   if ((png_ptr->transformations & PNG_COMPOSE) != 0)
      png_do_compose(row_info, png_ptr->row_buf + 1, png_ptr);
#endif

#ifdef PNG_READ_GAMMA_SUPPORTED
   if ((png_ptr->transformations & PNG_GAMMA) != 0 &&
#ifdef PNG_READ_RGB_TO_GRAY_SUPPORTED
      /* Because RGB_TO_GRAY does the gamma transform. */
      (png_ptr->transformations & PNG_RGB_TO_GRAY) == 0 &&
#endif
#if defined(PNG_READ_BACKGROUND_SUPPORTED) ||\
   defined(PNG_READ_ALPHA_MODE_SUPPORTED)
      /* Because PNG_COMPOSE does the gamma transform if there is something to
       * do (if there is an alpha channel or transparency.)
       */
       !((png_ptr->transformations & PNG_COMPOSE) != 0 &&
       ((png_ptr->num_trans != 0) ||
       (png_ptr->color_type & PNG_COLOR_MASK_ALPHA) != 0)) &&
#endif
      /* Because png_init_read_transformations transforms the palette, unless
       * RGB_TO_GRAY will do the transform.
       */
       (png_ptr->color_type != PNG_COLOR_TYPE_PALETTE))
      png_do_gamma(row_info, png_ptr->row_buf + 1, png_ptr);
#endif

#ifdef PNG_READ_STRIP_ALPHA_SUPPORTED
   if ((png_ptr->transformations & PNG_STRIP_ALPHA) != 0 &&
       (png_ptr->transformations & PNG_COMPOSE) != 0 &&
       (row_info->color_type == PNG_COLOR_TYPE_RGB_ALPHA ||
       row_info->color_type == PNG_COLOR_TYPE_GRAY_ALPHA))
      png_do_strip_channel(row_info, png_ptr->row_buf + 1,
          0 /* at_start == false, because SWAP_ALPHA happens later */);
#endif

#ifdef PNG_READ_ALPHA_MODE_SUPPORTED
   if ((png_ptr->transformations & PNG_ENCODE_ALPHA) != 0 &&
       (row_info->color_type & PNG_COLOR_MASK_ALPHA) != 0)
      png_do_encode_alpha(row_info, png_ptr->row_buf + 1, png_ptr);
#endif

#ifdef PNG_READ_SCALE_16_TO_8_SUPPORTED
   if ((png_ptr->transformations & PNG_SCALE_16_TO_8) != 0)
      png_do_scale_16_to_8(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_STRIP_16_TO_8_SUPPORTED
   /* There is no harm in doing both of these because only one has any effect,
    * by putting the 'scale' option first if the app asks for scale (either by
    * calling the API or in a TRANSFORM flag) this is what happens.
    */
   if ((png_ptr->transformations & PNG_16_TO_8) != 0)
      png_do_chop(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_QUANTIZE_SUPPORTED
   if ((png_ptr->transformations & PNG_QUANTIZE) != 0)
   {
      png_do_quantize(row_info, png_ptr->row_buf + 1,
          png_ptr->palette_lookup, png_ptr->quantize_index);

      if (row_info->rowbytes == 0)
         png_error(png_ptr, "png_do_quantize returned rowbytes=0");
   }
#endif /* READ_QUANTIZE */

#ifdef PNG_READ_EXPAND_16_SUPPORTED
   /* Do the expansion now, after all the arithmetic has been done.  Notice
    * that previous transformations can handle the PNG_EXPAND_16 flag if this
    * is efficient (particularly true in the case of gamma correction, where
    * better accuracy results faster!)
    */
   if ((png_ptr->transformations & PNG_EXPAND_16) != 0)
      png_do_expand_16(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_GRAY_TO_RGB_SUPPORTED
   /* NOTE: moved here in 1.5.4 (from much later in this list.) */
   if ((png_ptr->transformations & PNG_GRAY_TO_RGB) != 0 &&
       (png_ptr->mode & PNG_BACKGROUND_IS_GRAY) != 0)
      png_do_gray_to_rgb(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_INVERT_SUPPORTED
   if ((png_ptr->transformations & PNG_INVERT_MONO) != 0)
      png_do_invert(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_INVERT_ALPHA_SUPPORTED
   if ((png_ptr->transformations & PNG_INVERT_ALPHA) != 0)
      png_do_read_invert_alpha(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_SHIFT_SUPPORTED
   if ((png_ptr->transformations & PNG_SHIFT) != 0)
      png_do_unshift(row_info, png_ptr->row_buf + 1,
          &(png_ptr->shift));
#endif

#ifdef PNG_READ_PACK_SUPPORTED
   if ((png_ptr->transformations & PNG_PACK) != 0)
      png_do_unpack(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_CHECK_FOR_INVALID_INDEX_SUPPORTED
   /* Added at libpng-1.5.10 */
   if (row_info->color_type == PNG_COLOR_TYPE_PALETTE &&
       png_ptr->num_palette_max >= 0)
      png_do_check_palette_indexes(png_ptr, row_info);
#endif

#ifdef PNG_READ_BGR_SUPPORTED
   if ((png_ptr->transformations & PNG_BGR) != 0)
      png_do_bgr(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_PACKSWAP_SUPPORTED
   if ((png_ptr->transformations & PNG_PACKSWAP) != 0)
      png_do_packswap(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_FILLER_SUPPORTED
   if ((png_ptr->transformations & PNG_FILLER) != 0)
      png_do_read_filler(row_info, png_ptr->row_buf + 1,
          (png_uint_32)png_ptr->filler, png_ptr->flags);
#endif

#ifdef PNG_READ_SWAP_ALPHA_SUPPORTED
   if ((png_ptr->transformations & PNG_SWAP_ALPHA) != 0)
      png_do_read_swap_alpha(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_16BIT_SUPPORTED
#ifdef PNG_READ_SWAP_SUPPORTED
   if ((png_ptr->transformations & PNG_SWAP_BYTES) != 0)
      png_do_swap(row_info, png_ptr->row_buf + 1);
#endif
#endif

#ifdef PNG_READ_USER_TRANSFORM_SUPPORTED
   if ((png_ptr->transformations & PNG_USER_TRANSFORM) != 0)
   {
      if (png_ptr->read_user_transform_fn != NULL)
         (*(png_ptr->read_user_transform_fn)) /* User read transform function */
             (png_ptr,     /* png_ptr */
             row_info,     /* row_info: */
                /*  png_uint_32 width;       width of row */
                /*  size_t rowbytes;         number of bytes in row */
                /*  png_byte color_type;     color type of pixels */
                /*  png_byte bit_depth;      bit depth of samples */
                /*  png_byte channels;       number of channels (1-4) */
                /*  png_byte pixel_depth;    bits per pixel (depth*channels) */
             png_ptr->row_buf + 1);    /* start of pixel data for row */
#ifdef PNG_USER_TRANSFORM_PTR_SUPPORTED
      if (png_ptr->user_transform_depth != 0)
         row_info->bit_depth = png_ptr->user_transform_depth;

      if (png_ptr->user_transform_channels != 0)
         row_info->channels = png_ptr->user_transform_channels;
#endif
      row_info->pixel_depth = (png_byte)(row_info->bit_depth *
          row_info->channels);

      row_info->rowbytes = PNG_ROWBYTES(row_info->pixel_depth, row_info->width);
   }
#endif
}